

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

Entry * __thiscall
Lib::
DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntryToInsert(DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *this,TermList *key)

{
  bool bVar1;
  type tVar2;
  TermList *in_RSI;
  uint *in_RDI;
  uint h2;
  Entry *res;
  int pos;
  uint h1;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_2c;
  uint local_20;
  Entry *local_8;
  
  ensureExpanded((DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  tVar2 = DefaultHash::hash<Kernel::TermList>((TermList *)0x3d4b97);
  local_20 = tVar2 % in_RDI[4];
  local_8 = (Entry *)(*(long *)(in_RDI + 6) + (long)(int)local_20 * 0x20);
  if (((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) &&
     (bVar1 = Kernel::TermList::operator==(&local_8->_key,in_RSI), !bVar1)) {
    (local_8->field_0)._infoData = (local_8->field_0)._infoData & 0xfffffffdU | 2;
    tVar2 = DefaultHash2::hash<Kernel::TermList>((TermList *)0x3d4c11);
    local_2c = tVar2 % in_RDI[4];
    if (local_2c == 0) {
      local_2c = 1;
    }
    do {
      local_20 = (local_20 + local_2c) % in_RDI[4];
      local_8 = (Entry *)(*(long *)(in_RDI + 6) + (long)(int)local_20 * 0x20);
      bVar1 = false;
      if ((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) {
        bVar1 = Kernel::TermList::operator!=(&local_8->_key,in_RSI);
      }
    } while (bVar1 != false);
  }
  return local_8;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }